

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlitePagerOpen(unqlite_vfs *pVfs,unqlite *pDb,char *zFilename,uint iFlags)

{
  int iVar1;
  uint uVar2;
  sxu32 nByte_00;
  Pager *pPager_00;
  Page **ppPVar3;
  char *pcVar4;
  int local_5c;
  uint local_58;
  int rc;
  sxu32 nLen;
  sxu32 nByte;
  Pager *pPager;
  int no_jrnl;
  int rd_only;
  int is_mem;
  unqlite_kv_methods *pMethods;
  uint iFlags_local;
  char *zFilename_local;
  unqlite *pDb_local;
  unqlite_vfs *pVfs_local;
  
  if (((iFlags & 0x80) == 0) && (iVar1 = unqliteInMemory(zFilename), iVar1 == 0)) {
    _rd_only = unqliteFindKVStore("hash",4);
    pMethods._4_4_ = iFlags;
    if (_rd_only == (unqlite_kv_methods *)0x0) {
      _rd_only = unqliteFindKVStore("btree",5);
    }
  }
  else {
    _rd_only = unqliteFindKVStore("mem",3);
    pMethods._4_4_ = iFlags | 0x80;
  }
  if (_rd_only == (unqlite_kv_methods *)0x0) {
    unqliteGenError(pDb,"Cannot install a default Key/Value storage engine");
    return -0x11;
  }
  uVar2 = (uint)((pMethods._4_4_ & 0x80) != 0);
  pPager._4_4_ = (uint)((pMethods._4_4_ & 0x40) != 0);
  if (uVar2 != 0) {
    pPager._4_4_ = 1;
  }
  rc = 0x260;
  local_58 = 0;
  if (uVar2 == 0) {
    local_58 = SyStrlen(zFilename);
    rc = pVfs->mxPathname + local_58 + 0x261;
  }
  pPager_00 = (Pager *)SyMemBackendAlloc(&pDb->sMem,rc);
  if (pPager_00 == (Pager *)0x0) {
    return -1;
  }
  SyZero(pPager_00,rc);
  pPager_00->pAllocator = &pDb->sMem;
  pPager_00->pDb = pDb;
  (pDb->sDB).pPager = pPager_00;
  pPager_00->nSize = 0x80;
  nByte_00 = pPager_00->nSize << 3;
  ppPVar3 = (Page **)SyMemBackendAlloc(pPager_00->pAllocator,nByte_00);
  pPager_00->apHash = ppPVar3;
  if (pPager_00->apHash == (Page **)0x0) {
    local_5c = -1;
  }
  else {
    SyZero(pPager_00->apHash,nByte_00);
    pPager_00->is_mem = uVar2;
    pPager_00->no_jrnl = pPager._4_4_;
    pPager_00->is_rdonly = (uint)((pMethods._4_4_ & 1) != 0);
    pPager_00->iOpenFlags = pMethods._4_4_;
    pPager_00->pVfs = pVfs;
    SyRandomnessInit(&pPager_00->sPrng,(ProcRandomSeed)0x0,(void *)0x0);
    SyRandomness(&pPager_00->sPrng,&pPager_00->cksumInit,4);
    pPager_00->nCacheMax = 0xffffffff;
    if (uVar2 == 0) {
      pPager_00->zFilename = (char *)(pPager_00 + 1);
      local_5c = 0;
      if (pVfs->xFullPathname != (_func_int_unqlite_vfs_ptr_char_ptr_int_char_ptr *)0x0) {
        local_5c = (*pVfs->xFullPathname)
                             (pVfs,zFilename,pVfs->mxPathname + local_58,pPager_00->zFilename);
      }
      if (local_5c == 0) {
        local_58 = SyStrlen(pPager_00->zFilename);
      }
      else {
        SyMemcpy(zFilename,pPager_00->zFilename,local_58);
        pPager_00->zFilename[local_58] = '\0';
      }
      pcVar4 = (char *)SyMemBackendAlloc(pPager_00->pAllocator,local_58 + 0x12);
      pPager_00->zJournal = pcVar4;
      if (pPager_00->zJournal == (char *)0x0) {
        local_5c = -1;
        goto LAB_0011c60e;
      }
      SyMemcpy(pPager_00->zFilename,pPager_00->zJournal,local_58);
      SyMemcpy("_unqlite_journal",pPager_00->zJournal + local_58,0x10);
      pPager_00->zJournal[(ulong)local_58 + 0x10] = '\0';
    }
    local_5c = unqlitePagerRegisterKvEngine(pPager_00,_rd_only);
    if (local_5c == 0) {
      if (pPager_00->is_mem == 0) {
        pPager_00->iState = 0;
        pPager_00->iLock = 0;
      }
      else {
        pPager_00->iState = 5;
        pPager_00->iLock = 4;
      }
      return 0;
    }
  }
LAB_0011c60e:
  SyMemBackendFree(&pDb->sMem,pPager_00);
  return local_5c;
}

Assistant:

UNQLITE_PRIVATE int unqlitePagerOpen(
  unqlite_vfs *pVfs,       /* The virtual file system to use */
  unqlite *pDb,            /* Database handle */
  const char *zFilename,   /* Name of the database file to open */
  unsigned int iFlags      /* flags controlling this file */
  )
{
	unqlite_kv_methods *pMethods = 0;
	int is_mem,rd_only,no_jrnl;
	Pager *pPager;
	sxu32 nByte;
	sxu32 nLen;
	int rc;

	/* Select the appropriate KV storage subsytem  */
	if( (iFlags & UNQLITE_OPEN_IN_MEMORY) || unqliteInMemory(zFilename) ){
		/* An in-memory database, record that  */
		pMethods = unqliteFindKVStore("mem",sizeof("mem") - 1); /* Always available */
		iFlags |= UNQLITE_OPEN_IN_MEMORY;
	}else{
		/* Install the default key value storage subsystem [i.e. Linear Hash] */
		pMethods = unqliteFindKVStore("hash",sizeof("hash")-1);
		if( pMethods == 0 ){
			/* Use the b+tree storage backend if the linear hash storage is not available */
			pMethods = unqliteFindKVStore("btree",sizeof("btree")-1);
		}
	}
	if( pMethods == 0 ){
		/* Can't happen */
		unqliteGenError(pDb,"Cannot install a default Key/Value storage engine");
		return UNQLITE_NOTIMPLEMENTED;
	}
	is_mem = (iFlags & UNQLITE_OPEN_IN_MEMORY) != 0;
	rd_only = (iFlags & UNQLITE_OPEN_READONLY) != 0;
	no_jrnl = (iFlags & UNQLITE_OPEN_OMIT_JOURNALING) != 0;
	rc = UNQLITE_OK;
	if( is_mem ){
		/* Omit journaling for in-memory database */
		no_jrnl = 1;
	}
	/* Total number of bytes to allocate */
	nByte = sizeof(Pager);
	nLen = 0;
	if( !is_mem ){
		nLen = SyStrlen(zFilename);
		nByte += pVfs->mxPathname + nLen + sizeof(char) /* null terminator */;
	}
	/* Allocate */
	pPager = (Pager *)SyMemBackendAlloc(&pDb->sMem,nByte);
	if( pPager == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pPager,nByte);
	/* Fill-in the structure */
	pPager->pAllocator = &pDb->sMem;
	pPager->pDb = pDb;
	pDb->sDB.pPager = pPager;
	/* Allocate page table */
	pPager->nSize = 128; /* Must be a power of two */
	nByte = pPager->nSize * sizeof(Page *);
	pPager->apHash = (Page **)SyMemBackendAlloc(pPager->pAllocator,nByte);
	if( pPager->apHash == 0 ){
		rc = UNQLITE_NOMEM;
		goto fail;
	}
	SyZero(pPager->apHash,nByte);
	pPager->is_mem = is_mem;
	pPager->no_jrnl = no_jrnl;
	pPager->is_rdonly = rd_only;
	pPager->iOpenFlags = iFlags;
	pPager->pVfs = pVfs;
	SyRandomnessInit(&pPager->sPrng,0,0);
	SyRandomness(&pPager->sPrng,(void *)&pPager->cksumInit,sizeof(sxu32));
	/* Unlimited cache size */
	pPager->nCacheMax = SXU32_HIGH;
	/* Copy filename and journal name */
	if( !is_mem ){
		pPager->zFilename = (char *)&pPager[1];
		rc = UNQLITE_OK;
		if( pVfs->xFullPathname ){
			rc = pVfs->xFullPathname(pVfs,zFilename,pVfs->mxPathname + nLen,pPager->zFilename);
		}
		if( rc != UNQLITE_OK ){
			/* Simple filename copy */
			SyMemcpy(zFilename,pPager->zFilename,nLen);
			pPager->zFilename[nLen] = 0;
			rc = UNQLITE_OK;
		}else{
			nLen = SyStrlen(pPager->zFilename);
		}
		pPager->zJournal = (char *) SyMemBackendAlloc(pPager->pAllocator,nLen + sizeof(UNQLITE_JOURNAL_FILE_SUFFIX) + sizeof(char));
		if( pPager->zJournal == 0 ){
			rc = UNQLITE_NOMEM;
			goto fail;
		}
		/* Copy filename */
		SyMemcpy(pPager->zFilename,pPager->zJournal,nLen);
		/* Copy journal suffix */
		SyMemcpy(UNQLITE_JOURNAL_FILE_SUFFIX,&pPager->zJournal[nLen],sizeof(UNQLITE_JOURNAL_FILE_SUFFIX)-1);
		/* Append the nul terminator to the journal path */
		pPager->zJournal[nLen + ( sizeof(UNQLITE_JOURNAL_FILE_SUFFIX) - 1)] = 0;
	}
	/* Finally, register the selected KV engine */
	rc = unqlitePagerRegisterKvEngine(pPager,pMethods);
	if( rc != UNQLITE_OK ){
		goto fail;
	}
	/* Set the pager state */
	if( pPager->is_mem ){
		pPager->iState = PAGER_WRITER_FINISHED;
		pPager->iLock = EXCLUSIVE_LOCK;
	}else{
		pPager->iState = PAGER_OPEN;
		pPager->iLock = NO_LOCK;
	}
	/* All done, ready for processing */
	return UNQLITE_OK;
fail:
	SyMemBackendFree(&pDb->sMem,pPager);
	return rc;
}